

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

OUT * __thiscall
linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Current
          (OUT *__return_storage_ptr__,
          GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *this)

{
  _Rb_tree_color _Var1;
  IEnumerable<int_&> enumerable;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_> adapted;
  __shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2> local_60;
  IEnumerable<int_&> local_50;
  undefined **local_38;
  _Base_ptr *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_30 = &(this->current)._M_node[1]._M_parent;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = &PTR_Init_0013e200;
  IEnumerableCore::operator_cast_to_IEnumerable(&local_50,(IEnumerableCore *)&local_38);
  _Var1 = (this->current)._M_node[1]._M_color;
  std::__shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &local_50.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>);
  IGrouping<bool,_int_&>::IGrouping
            (__return_storage_ptr__,SUB41(_Var1,0),(shared_ptr<linq::IState<int_&>_> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  IEnumerable<int_&>::~IEnumerable(&local_50);
  return __return_storage_ptr__;
}

Assistant:

OUT Current() const override 
			{ 
				decltype(auto) adapted = AdaptView(current->second);
				decltype(auto) enumerable = (IEnumerable<VALUE&>)(adapted);
				return OUT{current->first, enumerable.state}; 
			}